

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O0

bool __thiscall
wasm::Match::Internal::MatchSelf<wasm::Match::Internal::NumberLitKind>::operator()
          (MatchSelf<wasm::Match::Internal::NumberLitKind> *this,Literal *lit,int32_t expected)

{
  bool bVar1;
  bool local_5d;
  Literal local_40;
  int32_t local_24;
  Literal *pLStack_20;
  int32_t expected_local;
  Literal *lit_local;
  MatchSelf<wasm::Match::Internal::NumberLitKind> *this_local;
  
  local_24 = expected;
  pLStack_20 = lit;
  lit_local = (Literal *)this;
  bVar1 = wasm::Type::isNumber(&lit->type);
  local_5d = false;
  if (bVar1) {
    wasm::Literal::makeFromInt32(&local_40,local_24,(Type)(lit->type).id);
    local_5d = wasm::Literal::operator==(&local_40,lit);
  }
  this_local._7_1_ = local_5d;
  if (bVar1) {
    wasm::Literal::~Literal(&local_40);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool operator()(Literal lit, int32_t expected) {
    return lit.type.isNumber() &&
           Literal::makeFromInt32(expected, lit.type) == lit;
  }